

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  GLFWwindow *handle;
  double (*padVar2) [50];
  Vertex *pVVar3;
  int y;
  long lVar4;
  long lVar5;
  GLFWwindow *window;
  double *pdVar6;
  double dVar7;
  double dVar8;
  int height;
  int width;
  double local_30;
  int local_20;
  int local_1c;
  
  glfwSetErrorCallback(error_callback);
  iVar1 = glfwInit();
  if (iVar1 != 0) {
    handle = glfwCreateWindow(0x280,0x1e0,"Wave Simulation",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    if (handle != (GLFWwindow *)0x0) {
      glfwSetKeyCallback(handle,key_callback);
      glfwSetFramebufferSizeCallback(handle,framebuffer_size_callback);
      glfwSetMouseButtonCallback(handle,mouse_button_callback);
      glfwSetCursorPosCallback(handle,cursor_position_callback);
      glfwSetScrollCallback(handle,scroll_callback);
      glfwMakeContextCurrent(handle);
      gladLoadGL(glfwGetProcAddress);
      glfwSwapInterval(1);
      window = handle;
      glfwGetFramebufferSize(handle,&local_1c,&local_20);
      framebuffer_size_callback(window,local_1c,local_20);
      init_opengl();
      init_vertices();
      init_grid();
      padVar2 = p;
      pVVar3 = vertex;
      lVar4 = 0;
      do {
        lVar5 = 8;
        pdVar6 = *padVar2;
        do {
          *(float *)((long)&pVVar3->x + lVar5) = (float)(*pdVar6 * 0.02);
          lVar5 = lVar5 + 0x18;
          pdVar6 = pdVar6 + 0x32;
        } while (lVar5 != 0x4b8);
        lVar4 = lVar4 + 1;
        padVar2 = (double (*) [50])((long)padVar2 + 8);
        pVVar3 = pVVar3 + 0x32;
      } while (lVar4 != 0x32);
      dVar7 = glfwGetTime();
      iVar1 = glfwWindowShouldClose(handle);
      if (iVar1 == 0) {
        local_30 = dVar7 + -0.01;
        do {
          dVar7 = glfwGetTime();
          for (local_30 = dVar7 - local_30; 0.0 < local_30; local_30 = local_30 - dVar8) {
            dVar8 = 0.01;
            if (local_30 <= 0.01) {
              dVar8 = local_30;
            }
            dt = dVar8;
            calc_grid();
          }
          pVVar3 = vertex;
          padVar2 = p;
          lVar4 = 0;
          do {
            lVar5 = 8;
            pdVar6 = *padVar2;
            do {
              *(float *)((long)&pVVar3->x + lVar5) = (float)(*pdVar6 * 0.02);
              lVar5 = lVar5 + 0x18;
              pdVar6 = pdVar6 + 0x32;
            } while (lVar5 != 0x4b8);
            lVar4 = lVar4 + 1;
            padVar2 = (double (*) [50])((long)padVar2 + 8);
            pVVar3 = pVVar3 + 0x32;
          } while (lVar4 != 0x32);
          draw_scene(handle);
          glfwPollEvents();
          iVar1 = glfwWindowShouldClose(handle);
          local_30 = dVar7;
        } while (iVar1 == 0);
      }
      glfwTerminate();
      exit(0);
    }
    glfwTerminate();
  }
  exit(1);
}

Assistant:

int main(int argc, char* argv[])
{
    GLFWwindow* window;
    double t, dt_total, t_old;
    int width, height;

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    window = glfwCreateWindow(640, 480, "Wave Simulation", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwSetKeyCallback(window, key_callback);
    glfwSetFramebufferSizeCallback(window, framebuffer_size_callback);
    glfwSetMouseButtonCallback(window, mouse_button_callback);
    glfwSetCursorPosCallback(window, cursor_position_callback);
    glfwSetScrollCallback(window, scroll_callback);

    glfwMakeContextCurrent(window);
    gladLoadGL(glfwGetProcAddress);
    glfwSwapInterval(1);

    glfwGetFramebufferSize(window, &width, &height);
    framebuffer_size_callback(window, width, height);

    // Initialize OpenGL
    init_opengl();

    // Initialize simulation
    init_vertices();
    init_grid();
    adjust_grid();

    // Initialize timer
    t_old = glfwGetTime() - 0.01;

    while (!glfwWindowShouldClose(window))
    {
        t = glfwGetTime();
        dt_total = t - t_old;
        t_old = t;

        // Safety - iterate if dt_total is too large
        while (dt_total > 0.f)
        {
            // Select iteration time step
            dt = dt_total > MAX_DELTA_T ? MAX_DELTA_T : dt_total;
            dt_total -= dt;

            // Calculate wave propagation
            calc_grid();
        }

        // Compute height of each vertex
        adjust_grid();

        // Draw wave grid to OpenGL display
        draw_scene(window);

        glfwPollEvents();
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}